

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O0

void jinit_d_main_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  jpeg_d_main_controller *pjVar1;
  JSAMPARRAY ppJVar2;
  jpeg_component_info *local_38;
  jpeg_component_info *compptr;
  int ngroups;
  int rgroup;
  int ci;
  my_main_ptr main;
  boolean need_full_buffer_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_d_main_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x88);
  cinfo->main = pjVar1;
  pjVar1->start_pass = start_pass_main;
  if (need_full_buffer != 0) {
    cinfo->err->msg_code = 3;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->upsample->need_context_rows == 0) {
    compptr._4_4_ = cinfo->min_DCT_v_scaled_size;
  }
  else {
    if (cinfo->min_DCT_v_scaled_size < 2) {
      cinfo->err->msg_code = 0x30;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    alloc_funny_pointers(cinfo);
    compptr._4_4_ = cinfo->min_DCT_v_scaled_size + 2;
  }
  ngroups = 0;
  local_38 = cinfo->comp_info;
  for (; ngroups < cinfo->num_components; ngroups = ngroups + 1) {
    ppJVar2 = (*cinfo->mem->alloc_sarray)
                        ((j_common_ptr)cinfo,1,
                         local_38->width_in_blocks * local_38->DCT_h_scaled_size,
                         ((local_38->v_samp_factor * local_38->DCT_v_scaled_size) /
                         cinfo->min_DCT_v_scaled_size) * compptr._4_4_);
    (&pjVar1[1].start_pass)[ngroups] = (_func_void_j_decompress_ptr_J_BUF_MODE *)ppJVar2;
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_main_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_main_ptr main;
  int ci, rgroup, ngroups;
  jpeg_component_info *compptr;

  main = (my_main_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_main_controller));
  cinfo->main = (struct jpeg_d_main_controller *) main;
  main->pub.start_pass = start_pass_main;

  if (need_full_buffer)		/* shouldn't happen */
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  /* Allocate the workspace.
   * ngroups is the number of row groups we need.
   */
  if (cinfo->upsample->need_context_rows) {
    if (cinfo->min_DCT_v_scaled_size < 2) /* unsupported, see comments above */
      ERREXIT(cinfo, JERR_NOTIMPL);
    alloc_funny_pointers(cinfo); /* Alloc space for xbuffer[] lists */
    ngroups = cinfo->min_DCT_v_scaled_size + 2;
  } else {
    ngroups = cinfo->min_DCT_v_scaled_size;
  }

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    rgroup = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
      cinfo->min_DCT_v_scaled_size; /* height of a row group of component */
    main->buffer[ci] = (*cinfo->mem->alloc_sarray)
			((j_common_ptr) cinfo, JPOOL_IMAGE,
			 compptr->width_in_blocks * compptr->DCT_h_scaled_size,
			 (JDIMENSION) (rgroup * ngroups));
  }
}